

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O1

WJTL_STATUS TestNumbers(void)

{
  WJTL_STATUS WVar1;
  WJTL_STATUS WVar2;
  WJTL_STATUS WVar3;
  WJTL_STATUS WVar4;
  WJTL_STATUS WVar5;
  WJTL_STATUS WVar6;
  WJTL_STATUS WVar7;
  WJTL_STATUS WVar8;
  WJTL_STATUS WVar9;
  WJTL_STATUS WVar10;
  WJTL_STATUS WVar11;
  WJTL_STATUS WVar12;
  WJTL_STATUS WVar13;
  WJTL_STATUS WVar14;
  WJTL_STATUS WVar15;
  WJTL_STATUS WVar16;
  WJTL_STATUS WVar17;
  WJTL_STATUS WVar18;
  WJTL_STATUS WVar19;
  WJTL_STATUS WVar20;
  WJTL_STATUS WVar21;
  WJTL_STATUS WVar22;
  WJTL_STATUS WVar23;
  WJTL_STATUS WVar24;
  WJTL_STATUS WVar25;
  WJTL_STATUS WVar26;
  WJTL_STATUS WVar27;
  
  WVar1 = VerifyOutputUnsigned(10,"10");
  WjTestLib_Assert(WVar1 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x71);
  WVar2 = VerifyOutputUnsigned(0,"0");
  WjTestLib_Assert(WVar2 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( 0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x72);
  WVar3 = VerifyOutputUnsigned(0xffffffffffffffff,"18446744073709551615");
  WjTestLib_Assert(WVar3 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputUnsigned( (18446744073709551615UL), \"18446744073709551615\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x73);
  WVar4 = VerifyOutputSigned(10,"10");
  WjTestLib_Assert(WVar4 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( 10, \"10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x75);
  WVar5 = VerifyOutputSigned(-10,"-10");
  WjTestLib_Assert(WVar5 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputSigned( -10, \"-10\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x76);
  WVar6 = VerifyOutputFloat(0.0,"0");
  WjTestLib_Assert(WVar6 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 0.0, \"0\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x78);
  WVar7 = VerifyOutputFloat(10.1,"10.1");
  WjTestLib_Assert(WVar7 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 10.1, \"10.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x79);
  WVar8 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar8 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.34e+125, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7a);
  WVar9 = VerifyOutputFloat(2.34e+125,"2.34e+125");
  WjTestLib_Assert(WVar9 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 234e123, \"2.34e+125\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7b);
  WVar10 = VerifyOutputFloat(2.1,"2.1");
  WjTestLib_Assert(WVar10 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1, \"2.1\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7d);
  WVar11 = VerifyOutputFloat(2.11,"2.11");
  WjTestLib_Assert(WVar11 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11, \"2.11\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7e);
  WVar12 = VerifyOutputFloat(2.111,"2.111");
  WjTestLib_Assert(WVar12 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111, \"2.111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x7f);
  WVar13 = VerifyOutputFloat(2.1111,"2.1111");
  WjTestLib_Assert(WVar13 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111, \"2.1111\" ))) == (JL_STATUS_SUCCESS)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x80);
  WVar14 = VerifyOutputFloat(2.11111,"2.11111");
  WjTestLib_Assert(WVar14 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111, \"2.11111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x81);
  WVar15 = VerifyOutputFloat(2.111111,"2.111111");
  WjTestLib_Assert(WVar15 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111, \"2.111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x82);
  WVar16 = VerifyOutputFloat(2.1111111,"2.1111111");
  WjTestLib_Assert(WVar16 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111, \"2.1111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x83);
  WVar17 = VerifyOutputFloat(2.11111111,"2.11111111");
  WjTestLib_Assert(WVar17 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111, \"2.11111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x84);
  WVar18 = VerifyOutputFloat(2.111111111,"2.111111111");
  WjTestLib_Assert(WVar18 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111, \"2.111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x85);
  WVar19 = VerifyOutputFloat(2.1111111111,"2.1111111111");
  WjTestLib_Assert(WVar19 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111, \"2.1111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x86);
  WVar20 = VerifyOutputFloat(2.11111111111,"2.11111111111");
  WjTestLib_Assert(WVar20 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111, \"2.11111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x87);
  WVar21 = VerifyOutputFloat(2.111111111111,"2.111111111111");
  WjTestLib_Assert(WVar21 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111, \"2.111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x88);
  WVar22 = VerifyOutputFloat(2.1111111111111,"2.1111111111111");
  WjTestLib_Assert(WVar22 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.1111111111111, \"2.1111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x89);
  WVar23 = VerifyOutputFloat(2.11111111111111,"2.11111111111111");
  WjTestLib_Assert(WVar23 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.11111111111111, \"2.11111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8a);
  WVar24 = VerifyOutputFloat(2.111111111111111,"2.111111111111111");
  WjTestLib_Assert(WVar24 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.111111111111111, \"2.111111111111111\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x8b);
  WVar25 = VerifyOutputFloat(1.79769313486232e+308,"1.797693134862316e+308");
  WjTestLib_Assert(WVar25 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 1.7976931348623157e+308, \"1.797693134862316e+308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x91);
  WVar26 = VerifyOutputFloat(2.2250738585072014e-308,"2.225073858507201e-308");
  WjTestLib_Assert(WVar26 == WJTL_STATUS_SUCCESS,
                   "((JL_STATUS)(VerifyOutputFloat( 2.2250738585072014e-308, \"2.225073858507201e-308\" ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Output.c"
                   ,"TestNumbers",0x92);
  WVar27 = WJTL_STATUS_FAILED;
  if (((WVar26 == WJTL_STATUS_SUCCESS && WVar25 == WJTL_STATUS_SUCCESS) &&
      ((((WVar21 == WJTL_STATUS_SUCCESS && WVar22 == WJTL_STATUS_SUCCESS) &&
        WVar23 == WJTL_STATUS_SUCCESS) &&
       ((WVar19 == WJTL_STATUS_SUCCESS && WVar20 == WJTL_STATUS_SUCCESS) &&
       (WVar18 == WJTL_STATUS_SUCCESS && WVar17 == WJTL_STATUS_SUCCESS))) &&
      WVar24 == WJTL_STATUS_SUCCESS)) &&
      ((((((WVar5 == WJTL_STATUS_SUCCESS && WVar6 == WJTL_STATUS_SUCCESS) &&
          ((WVar3 == WJTL_STATUS_SUCCESS && WVar4 == WJTL_STATUS_SUCCESS) &&
          (WVar2 == WJTL_STATUS_SUCCESS && WVar1 == WJTL_STATUS_SUCCESS))) &&
         WVar7 == WJTL_STATUS_SUCCESS) && WVar8 == WJTL_STATUS_SUCCESS) &&
       WVar16 == WJTL_STATUS_SUCCESS) &&
      (((WVar13 == WJTL_STATUS_SUCCESS && WVar14 == WJTL_STATUS_SUCCESS) &&
       WVar15 == WJTL_STATUS_SUCCESS) &&
      ((WVar11 == WJTL_STATUS_SUCCESS && WVar12 == WJTL_STATUS_SUCCESS) &&
      (WVar10 == WJTL_STATUS_SUCCESS && WVar9 == WJTL_STATUS_SUCCESS))))) {
    WVar27 = WJTL_STATUS_SUCCESS;
  }
  return WVar27;
}

Assistant:

static
WJTL_STATUS
    TestNumbers
    (
        bool            IsJson5
    )
{
    WJTL_STATUS TestReturn = WJTL_STATUS_SUCCESS;

    // Test valid numbers
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "1", 1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, " 100", 100 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, " 18446744073709551615 ", UINT64_MAX ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectSigned( IsJson5, " -1 ", -1 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectSigned( IsJson5, " -9223372036854775808 ", INT64_MIN ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, " 1.0 ", 1.0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, " -1.0 ", -1.0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "12345.67891", 12345.67891 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "123.45e50", 123.45e50 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "123.45e+50", 123.45e50 ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "-123.45e-50", -123.45e-50 ) );

    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "1.7976931348623158e308", DBL_MAX ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "1.7976931348623158e+308", DBL_MAX ) );
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "2.2250738585072014e-308", DBL_MIN ) );

    // Very large integers will be treated as floating point if they can't be represented in a uint64_t or int64_t.
    // Verify that it gets rounded to correct float
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "18446744073709551616", 18446744073709552000.0 ) ); // Rounded
    JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "-9223372036854775809", -9223372036854775800.0 ) ); // Rounded

    // Test technically valid json numbers but ones our implementation can not handle
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1e309", 0 ) );      // This will become Inf
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-1e309", 0 ) );      // This will become -Inf

    if( IsJson5 )
    {
        // Test hex numbers
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x0", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x0000", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x1", 1 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0x1234", 0x1234 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0X1234", 0X1234 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xabcd", 0xabcd ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xEEFF", 0xeeff ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "0xffffffffffffffff", 0xffffffffffffffff ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x1ffffffffffffffff", 0 ) );
    }

    if( IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, ".2", 0.2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "+0.2", 0.2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectFloat( IsJson5, "2.", 2 ) );
        JL_ASSERT_SUCCESS( VerifyJsonParsesAsNumberObjectUnsigned( IsJson5, "+2", 2 ) );

        // Test special "numbers"
        double f64 = 0;
        const double a_inf = DBL_MAX * 2.0;
        const double a_ninf = DBL_MAX * -2.0;

        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "Inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "+Inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "+inf", &f64 ) );
        JL_ASSERT( a_inf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "-Inf", &f64 ) );
        JL_ASSERT( a_ninf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "-inf", &f64 ) );
        JL_ASSERT( a_ninf == f64 );
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "NaN", &f64 ) );
        JL_ASSERT( f64 != f64 );        // Tests for NaN
        JL_ASSERT_SUCCESS( ParseJsonAsFloat( IsJson5, "NaN", &f64 ) );
        JL_ASSERT( f64 != f64 );        // Tests for NaN
    }
    else
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, ".2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+0.2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "2.", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+2", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "+Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-Inf", 0 ) );
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "Nan", 0 ) );
    }

    // Test invalid numbers
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1.2.3", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "E10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "-E10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E.10", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "11E1.0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E1+0", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "1E1-0", 0 ) );

    if( !IsJson5 )
    {
        JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, " 0x1234", 1 ) );
    }
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x12.34", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x111G", 0 ) );
    JL_ASSERT_SUCCESS( VerifyJsonUnableToParse( IsJson5, "0x", 0 ) );

    return TestReturn;
}